

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O1

void sshproxy_notify_remote_disconnect_callback(void *vctx)

{
  char cVar1;
  
  cVar1 = (**(code **)(**(long **)((long)vctx + 0x18) + 0x40))();
  if (cVar1 != '\0') {
    return;
  }
  sshproxy_send_close((SshProxy *)vctx);
  return;
}

Assistant:

static void sshproxy_notify_remote_disconnect_callback(void *vctx)
{
    SshProxy *sp = (SshProxy *)vctx;

    /* notify_remote_disconnect can be called redundantly, so first
     * check if the backend really has become disconnected */
    if (backend_connected(sp->backend))
        return;

    sshproxy_send_close(sp);
}